

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::CompressionParameters> *
kj::_::compareClientAndServerConfigs
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          CompressionParameters *requestConfig,CompressionParameters *manualConfig)

{
  bool bVar1;
  ushort uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  CompressionParameters local_30;
  
  uVar2._0_1_ = manualConfig->outboundNoContextTakeover;
  uVar2._1_1_ = manualConfig->inboundNoContextTakeover;
  local_30.outboundMaxWindowBits.ptr.isSet = (manualConfig->outboundMaxWindowBits).ptr.isSet;
  if (local_30.outboundMaxWindowBits.ptr.isSet == true) {
    local_30.outboundMaxWindowBits.ptr.field_1 = (manualConfig->outboundMaxWindowBits).ptr.field_1;
  }
  local_30.inboundMaxWindowBits.ptr.isSet = (manualConfig->inboundMaxWindowBits).ptr.isSet;
  if (local_30.inboundMaxWindowBits.ptr.isSet == true) {
    local_30.inboundMaxWindowBits.ptr.field_1 = (manualConfig->inboundMaxWindowBits).ptr.field_1;
  }
  local_30._0_2_ = uVar2;
  if (uVar2 < 0x100) {
    local_30._0_2_ = uVar2 & 0xff;
  }
  if (((undefined1)uVar2 == '\0') &&
     (local_30._0_2_ = local_30._0_2_ & 0xff00, requestConfig->outboundNoContextTakeover == true)) {
LAB_003096fd:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    if (((requestConfig->inboundMaxWindowBits).ptr.isSet & local_30.inboundMaxWindowBits.ptr.isSet)
        == 1) {
      aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              (requestConfig->inboundMaxWindowBits).ptr.field_1.value;
      if (aVar3.value < (manualConfig->inboundMaxWindowBits).ptr.field_1.value) {
        local_30.inboundMaxWindowBits.ptr.isSet = true;
        local_30.inboundMaxWindowBits.ptr.field_1 = aVar3;
      }
    }
    else if (local_30.inboundMaxWindowBits.ptr.isSet != false) {
      local_30.inboundMaxWindowBits.ptr.isSet = false;
    }
    bVar1 = (requestConfig->outboundMaxWindowBits).ptr.isSet;
    if (local_30.outboundMaxWindowBits.ptr.isSet == false) {
      if (bVar1 != false) goto LAB_003096fd;
    }
    else if ((bVar1 != false) &&
            (aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                     (requestConfig->outboundMaxWindowBits).ptr.field_1.value,
            aVar3.value < (manualConfig->outboundMaxWindowBits).ptr.field_1.value)) {
      local_30.outboundMaxWindowBits.ptr.isSet = true;
      local_30.outboundMaxWindowBits.ptr.field_1 = aVar3;
    }
    NullableValue<kj::CompressionParameters>::NullableValue(&__return_storage_ptr__->ptr,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> compareClientAndServerConfigs(CompressionParameters requestConfig,
    CompressionParameters manualConfig) {
  // We start from the `manualConfig` and go through a series of filters to get a compression
  // configuration that both the client and the server can agree upon. If no agreement can be made,
  // we return null.

  CompressionParameters acceptedParameters = manualConfig;

  // We only need to modify `client_no_context_takeover` and `server_no_context_takeover` when
  // `manualConfig` doesn't include them.
  if (manualConfig.inboundNoContextTakeover == false) {
    acceptedParameters.inboundNoContextTakeover = false;
  }

  if (manualConfig.outboundNoContextTakeover == false) {
    acceptedParameters.outboundNoContextTakeover = false;
    if (requestConfig.outboundNoContextTakeover == true) {
      // The client has told the server to not use context takeover. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }

  // client_max_window_bits
  if (requestConfig.inboundMaxWindowBits != kj::none &&
      manualConfig.inboundMaxWindowBits != kj::none)  {
    // We want `min(requestConfig, manualConfig)` in this case.
    auto reqBits = KJ_ASSERT_NONNULL(requestConfig.inboundMaxWindowBits);
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.inboundMaxWindowBits);
    if (reqBits < manualBits) {
      acceptedParameters.inboundMaxWindowBits = reqBits;
    }
  } else {
    // We will not reply with `client_max_window_bits`.
    acceptedParameters.inboundMaxWindowBits = kj::none;
  }

  // server_max_window_bits
  if (manualConfig.outboundMaxWindowBits != kj::none) {
    auto manualBits = KJ_ASSERT_NONNULL(manualConfig.outboundMaxWindowBits);
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // We want `min(requestConfig, manualConfig)` in this case.
      auto reqBits = KJ_ASSERT_NONNULL(requestConfig.outboundMaxWindowBits);
      if (reqBits < manualBits) {
        acceptedParameters.outboundMaxWindowBits = reqBits;
      }
    }
  } else {
    acceptedParameters.outboundMaxWindowBits = kj::none;
    if (requestConfig.outboundMaxWindowBits != kj::none) {
      // The client has told the server to use `server_max_window_bits`. This is not a "hint",
      // rather it is a restriction on the server's configuration. If the server does not support
      // the configuration, it must reject the offer.
      return kj::none;
    }
  }
  return acceptedParameters;
}